

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_node * fy_node_by_path_internal(fy_node *fyn,char *path,size_t pathlen,fy_node_walk_flags flags)

{
  fy_node_walk_flags fVar1;
  _Bool _Var2;
  char cVar3;
  int iVar4;
  ushort **ppuVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  fy_node *pfVar9;
  void *pvVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  char acStack_e8 [8];
  char *local_e0;
  bool local_d6;
  bool local_d5;
  fy_node_walk_flags local_d4;
  bool local_cf;
  bool local_ce;
  bool local_cd;
  fy_node_walk_flags local_cc;
  bool local_c5;
  fy_node_walk_flags local_c4;
  bool local_be;
  bool local_bd;
  int local_bc;
  _Bool trailing_slash;
  int code_length;
  uint8_t code [4];
  size_t sStack_b0;
  _Bool has_json_key_esc;
  size_t uri_path_len;
  size_t json_key_len;
  size_t len;
  int local_90;
  int rlen;
  int idx;
  char c;
  char *uri_path;
  char *p;
  char *t;
  char *json_key;
  char *end_idx;
  char *ee;
  char *ss;
  char *e;
  char *s;
  fy_node *fyni;
  fy_node *fynt;
  fy_node_walk_flags ptr_flags;
  fy_node_walk_flags flags_local;
  size_t pathlen_local;
  char *path_local;
  fy_node *fyn_local;
  
  pcVar7 = acStack_e8;
  pcVar11 = acStack_e8;
  if ((fyn == (fy_node *)0x0) || (path == (char *)0x0)) {
    return (fy_node *)0x0;
  }
  fynt._0_4_ = flags & (FYNWF_PTR_RELJSON|FYNWF_PTR_JSON);
  e = path;
  fynt._4_4_ = flags;
  _ptr_flags = pathlen;
  pathlen_local = (size_t)path;
  path_local = (char *)fyn;
  if (pathlen == 0xffffffffffffffff) {
    _ptr_flags = strlen(path);
  }
  ss = e + _ptr_flags;
  local_be = false;
  if (_ptr_flags != 0) {
    local_be = *(char *)(pathlen_local + (_ptr_flags - 1)) == '/';
  }
  local_bd = local_be;
  local_c4 = (fy_node_walk_flags)fynt;
  if ((fy_node_walk_flags)fynt == FYNWF_DONT_FOLLOW) {
LAB_0012cb76:
    while( true ) {
      local_c5 = false;
      if (e < ss) {
        local_c5 = *e == '/';
      }
      if (local_c5 == false) break;
      e = e + 1;
    }
    if (ss <= e) goto LAB_0012d6bd;
  }
  else if ((fy_node_walk_flags)fynt == FYNWF_PTR_JSON) {
    if (e == ss) {
      return (fy_node *)path_local;
    }
    if (*e != '/') {
      return (fy_node *)0x0;
    }
    e = e + 1;
  }
  else if ((fy_node_walk_flags)fynt != FYNWF_PTR_RELJSON) goto LAB_0012cb76;
  path_local = (char *)fy_node_follow_aliases((fy_node *)path_local,fynt._4_4_,true);
  _Var2 = fy_node_is_scalar((fy_node *)path_local);
  if (_Var2) {
    path_local = (char *)0x0;
    pcVar7 = acStack_e8;
  }
  else {
    _Var2 = fy_node_is_sequence((fy_node *)path_local);
    if (_Var2) {
      local_cc = (fy_node_walk_flags)fynt;
      if (((fy_node_walk_flags)fynt == FYNWF_DONT_FOLLOW) ||
         (((fy_node_walk_flags)fynt != FYNWF_PTR_JSON &&
          ((fy_node_walk_flags)fynt != FYNWF_PTR_RELJSON)))) {
        while( true ) {
          local_cd = false;
          if (e < ss) {
            ppuVar5 = __ctype_b_loc();
            local_cd = ((*ppuVar5)[(int)*e] & 0x2000) != 0;
          }
          if (local_cd == false) break;
          e = e + 1;
        }
        cVar3 = *e;
        if (cVar3 == '[') {
          e = e + 1;
        }
        else {
          ppuVar5 = __ctype_b_loc();
          if ((((*ppuVar5)[(int)cVar3] & 0x800) == 0) && (cVar3 != '-')) {
            return (fy_node *)0x0;
          }
        }
        lVar6 = strtol(e,&json_key,10);
        local_90 = (int)lVar6;
        if ((local_90 == 0) && (json_key == e)) {
          return (fy_node *)0x0;
        }
        e = json_key;
        while( true ) {
          local_ce = false;
          if (e < ss) {
            ppuVar5 = __ctype_b_loc();
            local_ce = ((*ppuVar5)[(int)*e] & 0x2000) != 0;
          }
          if (local_ce == false) break;
          e = e + 1;
        }
        if ((cVar3 == '[') && (cVar3 = *e, e = e + 1, cVar3 != ']')) {
          return (fy_node *)0x0;
        }
        while( true ) {
          local_cf = false;
          if (e < ss) {
            ppuVar5 = __ctype_b_loc();
            local_cf = ((*ppuVar5)[(int)*e] & 0x2000) != 0;
          }
          if (local_cf == false) break;
          e = e + 1;
        }
      }
      else {
        if (*e == '-') {
          return (fy_node *)0x0;
        }
        lVar6 = strtol(e,&json_key,10);
        local_90 = (int)lVar6;
        if ((local_90 == 0) && (json_key == e)) {
          return (fy_node *)0x0;
        }
        if (local_90 < 0) {
          return (fy_node *)0x0;
        }
        e = json_key;
        if ((json_key < ss) && (*json_key == '/')) {
          e = json_key + 1;
        }
      }
      sVar8 = (long)ss - (long)e;
      path_local = (char *)fy_node_sequence_get_by_index((fy_node *)path_local,local_90);
      if ((local_bd & 1U) != 0) {
        path_local = (char *)fy_node_follow_aliases((fy_node *)path_local,fynt._4_4_,false);
      }
      path_local = (char *)fy_node_by_path_internal((fy_node *)path_local,e,sVar8,fynt._4_4_);
      pcVar7 = acStack_e8;
    }
    else {
      _Var2 = fy_node_is_mapping((fy_node *)path_local);
      pcVar7 = e;
      if (!_Var2) {
        __assert_fail("fy_node_is_mapping(fyn)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                      ,0xe9f,
                      "struct fy_node *fy_node_by_path_internal(struct fy_node *, const char *, size_t, enum fy_node_walk_flags)"
                     );
      }
      pathlen_local = (size_t)e;
      _ptr_flags = (long)ss - (long)e;
      local_d4 = (fy_node_walk_flags)fynt;
      if (((fy_node_walk_flags)fynt == FYNWF_DONT_FOLLOW) ||
         (((fy_node_walk_flags)fynt != FYNWF_PTR_JSON &&
          ((fy_node_walk_flags)fynt != FYNWF_PTR_RELJSON)))) {
        while ((e < ss && (cVar3 = *e, cVar3 != '/'))) {
          e = e + 1;
          if (cVar3 == '\\') {
            if ((ss <= e) || (pcVar7 = strchr("/*&.{}[]\\",(int)*e), pcVar7 == (char *)0x0)) {
              return (fy_node *)0x0;
            }
            e = e + 1;
          }
          else {
            pcVar7 = e;
            if (cVar3 == '\"') {
              while( true ) {
                e = pcVar7;
                local_d5 = false;
                if (e < ss) {
                  local_d5 = *e != '\"';
                }
                if (local_d5 == false) break;
                pcVar7 = e + 1;
                if (((*e == '\\') && (pcVar7 < ss)) && (*pcVar7 == '\"')) {
                  pcVar7 = e + 2;
                }
              }
              if ((ss <= e) || (*e != '\"')) {
                return (fy_node *)0x0;
              }
              e = e + 1;
            }
            else if (cVar3 == '\'') {
              while( true ) {
                e = pcVar7;
                local_d6 = false;
                if (e < ss) {
                  local_d6 = *e != '\'';
                }
                if (local_d6 == false) break;
                pcVar7 = e + 1;
                if (((*e == '\'') && (pcVar7 < ss)) && (*pcVar7 == '\'')) {
                  pcVar7 = e + 2;
                }
              }
              if ((ss <= e) || (*e != '\'')) {
                return (fy_node *)0x0;
              }
              e = e + 1;
            }
          }
        }
        sVar8 = (long)e - pathlen_local;
        fyni = (fy_node *)path_local;
        path_local = (char *)fy_node_mapping_lookup_by_string
                                       ((fy_node *)path_local,(char *)pathlen_local,sVar8);
        pcVar7 = acStack_e8;
        if (((((fy_node *)path_local == (fy_node *)0x0) &&
             (pcVar7 = acStack_e8, fyni != (fy_node *)0x0)) &&
            (pcVar7 = acStack_e8, (fynt._4_4_ & FYNWF_FOLLOW) != FYNWF_DONT_FOLLOW)) &&
           (pcVar7 = acStack_e8, (fy_node_walk_flags)fynt == FYNWF_DONT_FOLLOW)) {
          path_local = (char *)fy_node_mapping_lookup_by_string(fyni,"<<",2);
          if ((fy_node *)path_local == (fy_node *)0x0) {
            path_local = (char *)0x0;
            pcVar7 = acStack_e8;
            goto LAB_0012d6bd;
          }
          _Var2 = fy_node_is_alias((fy_node *)path_local);
          if (_Var2) {
            pfVar9 = fy_node_follow_aliases((fy_node *)path_local,fynt._4_4_,false);
            path_local = (char *)fy_node_mapping_lookup_by_string
                                           (pfVar9,(char *)pathlen_local,sVar8);
            pcVar7 = acStack_e8;
          }
          else {
            _Var2 = fy_node_is_sequence((fy_node *)path_local);
            if (_Var2) {
              fyni = (fy_node *)path_local;
              for (s = (char *)fy_node_list_head((fy_node_list *)(path_local + 0x48));
                  pcVar7 = acStack_e8, s != (char *)0x0;
                  s = (char *)fy_node_next(&(fyni->field_12).sequence,(fy_node *)s)) {
                _Var2 = fy_node_is_alias((fy_node *)s);
                if (_Var2) {
                  pfVar9 = fy_node_follow_aliases((fy_node *)s,fynt._4_4_,false);
                  path_local = (char *)fy_node_mapping_lookup_by_string
                                                 (pfVar9,(char *)pathlen_local,sVar8);
                  pcVar7 = acStack_e8;
                  if ((fy_node *)path_local != (fy_node *)0x0) break;
                }
              }
            }
            else {
              path_local = (char *)0x0;
              pcVar7 = acStack_e8;
            }
          }
        }
      }
      else {
        code_length._3_1_ = '\0';
        while ((e < ss && (cVar3 = *e, cVar3 != '/'))) {
          e = e + 1;
          if (cVar3 == '~') {
            code_length._3_1_ = '\x01';
          }
        }
        json_key_len = (long)e - (long)pcVar7;
        if (code_length._3_1_ != '\0') {
          pcVar11 = acStack_e8 + -(json_key_len + 0x10 & 0xfffffffffffffff0);
          ee = pcVar7;
          end_idx = e;
          p = pcVar11;
          while (ee < end_idx) {
            if (*ee == '~') {
              if ((end_idx <= ee + 1) || ((ee[1] < '0' && ('1' < ee[1])))) {
                return (fy_node *)0x0;
              }
              cVar3 = '/';
              if (ee[1] == '0') {
                cVar3 = '~';
              }
              *p = cVar3;
              ee = ee + 2;
              p = p + 1;
            }
            else {
              cVar3 = *ee;
              ee = ee + 1;
              *p = cVar3;
              p = p + 1;
            }
          }
          json_key_len = (long)p - (long)pcVar11;
          pathlen_local = (size_t)pcVar11;
        }
        sVar8 = pathlen_local;
        if ((fynt._4_4_ & FYNWF_URI_ENCODED) != FYNWF_DONT_FOLLOW) {
          pcVar11[-8] = -0x3c;
          pcVar11[-7] = -0x2c;
          pcVar11[-6] = '\x12';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          pvVar10 = memchr((void *)sVar8,0x25,json_key_len);
          if (pvVar10 != (void *)0x0) {
            pcVar11 = pcVar11 + -(json_key_len + 0x10 & 0xfffffffffffffff0);
            ee = (char *)pathlen_local;
            end_idx = (char *)(pathlen_local + json_key_len);
            p = pcVar11;
            while (pcVar7 = ee, ee < end_idx) {
              sVar13 = (long)end_idx - (long)ee;
              pcVar11[-8] = '0';
              pcVar11[-7] = -0x2b;
              pcVar11[-6] = '\x12';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              pcVar12 = (char *)memchr(pcVar7,0x25,sVar13);
              pcVar7 = ee;
              local_e0 = pcVar12;
              if (pcVar12 == (char *)0x0) {
                local_e0 = end_idx;
              }
              iVar4 = (int)local_e0 - (int)ee;
              pcVar11[-8] = '{';
              pcVar11[-7] = -0x2b;
              pcVar11[-6] = '\x12';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              memcpy(p,pcVar7,(long)iVar4);
              pcVar7 = ee + iVar4;
              p = p + iVar4;
              ee = pcVar7;
              if (pcVar12 == (char *)0x0) break;
              local_bc = 4;
              sVar8 = (long)end_idx - (long)pcVar7;
              pcVar11[-8] = -0x28;
              pcVar11[-7] = -0x2b;
              pcVar11[-6] = '\x12';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              ee = fy_uri_esc(pcVar7,sVar8,&trailing_slash,&local_bc);
              if (ee == (char *)0x0) {
                return (fy_node *)0x0;
              }
              sVar13 = (size_t)local_bc;
              pcVar11[-8] = '\a';
              pcVar11[-7] = -0x2a;
              pcVar11[-6] = '\x12';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              memcpy(p,&trailing_slash,sVar13);
              p = p + local_bc;
            }
            sStack_b0 = (long)p - (long)pcVar11;
            json_key_len = sStack_b0;
            pathlen_local = (size_t)pcVar11;
          }
        }
        pcVar7 = path_local;
        sVar8 = pathlen_local;
        fyni = (fy_node *)path_local;
        pcVar11[-8] = 'd';
        pcVar11[-7] = -0x2a;
        pcVar11[-6] = '\x12';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        path_local = (char *)fy_node_mapping_lookup_value_by_simple_key
                                       ((fy_node *)pcVar7,(char *)sVar8,json_key_len);
        pcVar7 = pcVar11;
      }
      pcVar11 = path_local;
      fVar1 = fynt._4_4_;
      sVar8 = (long)ss - (long)e;
      if ((sVar8 != 0) && ((local_bd & 1U) != 0)) {
        *(undefined8 *)(pcVar7 + -8) = 0x12d69e;
        path_local = (char *)fy_node_follow_aliases((fy_node *)pcVar11,fVar1,true);
      }
      pcVar12 = path_local;
      fVar1 = fynt._4_4_;
      pcVar11 = e;
      *(undefined8 *)(pcVar7 + -8) = 0x12d6b9;
      path_local = (char *)fy_node_by_path_internal((fy_node *)pcVar12,pcVar11,sVar8,fVar1);
    }
  }
LAB_0012d6bd:
  pcVar11 = path_local;
  fVar1 = fynt._4_4_;
  if ((ss != e) && ((local_bd & 1U) != 0)) {
    *(undefined8 *)(pcVar7 + -8) = 0x12d6f3;
    path_local = (char *)fy_node_follow_aliases((fy_node *)pcVar11,fVar1,true);
  }
  return (fy_node *)path_local;
}

Assistant:

static struct fy_node *
fy_node_by_path_internal(struct fy_node *fyn,
                         const char *path, size_t pathlen,
                         enum fy_node_walk_flags flags) {
    enum fy_node_walk_flags ptr_flags;
    struct fy_node *fynt, *fyni;
    const char *s, *e, *ss, *ee;
    char *end_idx, *json_key, *t, *p, *uri_path;
    char c;
    int idx, rlen;
    size_t len, json_key_len, uri_path_len;
    bool has_json_key_esc;
    uint8_t code[4];
    int code_length;
    bool trailing_slash;

    if (!fyn || !path)
        return NULL;

    ptr_flags = flags & FYNWF_PTR(FYNWF_PTR_MASK);

    s = path;
    if (pathlen == (size_t) -1)
        pathlen = strlen(path);
    e = s + pathlen;

    /* a trailing slash works just like unix and symbolic links
	 * if it does not exist no symbolic link lookups are performed
	 * at the end of the operation.
	 * if it exists they are followed upon resolution
	 */
    trailing_slash = pathlen > 0 && path[pathlen - 1] == '/';

    /* and continue on path lookup with the rest */

    /* skip all prefixed / */
    switch (ptr_flags) {
        default:
        case FYNWF_PTR_YAML:
            while (s < e && *s == '/')
                s++;
            /* for a last component / always match this one */
            if (s >= e)
                goto out;
            break;

        case FYNWF_PTR_JSON:
            /* "" -> everything here */
            if (s == e)
                return fyn;
            /* it must have a separator here */
            if (*s != '/')
                return NULL;
            s++;
            break;

        case FYNWF_PTR_RELJSON:
            break;
    }

    /* fyd_notice(fyn->fyd, "%s:%d following alias @%s \"%.*s\"",
			__func__, __LINE__, fy_node_get_path(fyn), (int)(e - s), s); */
    fyn = fy_node_follow_aliases(fyn, flags, true);

    /* scalar can't match (it has no key) */
    if (fy_node_is_scalar(fyn)) {
        fyn = NULL;
        goto out;
    }

    /* for a sequence the only allowed key is [n] where n is the index to follow */
    if (fy_node_is_sequence(fyn)) {

        c = -1;
        switch (ptr_flags) {
            default:
            case FYNWF_PTR_YAML:
                while (s < e && isspace(*s))
                    s++;

                c = *s;
                if (c == '[')
                    s++;
                else if (!isdigit(c) && c != '-')
                    return NULL;

                idx = (int) strtol(s, &end_idx, 10);

                /* no digits found at all */
                if (idx == 0 && end_idx == s)
                    return NULL;

                s = end_idx;

                while (s < e && isspace(*s))
                    s++;

                if (c == '[' && *s++ != ']')
                    return NULL;

                while (s < e && isspace(*s))
                    s++;

                break;

            case FYNWF_PTR_JSON:
            case FYNWF_PTR_RELJSON:

                /* special array end - always fails */
                if (*s == '-')
                    return NULL;

                idx = (int) strtol(s, &end_idx, 10);

                /* no digits found at all */
                if (idx == 0 && end_idx == s)
                    return NULL;

                /* no negatives */
                if (idx < 0)
                    return NULL;

                s = end_idx;

                if (s < e && *s == '/')
                    s++;

                break;
        }

        len = e - s;

        fyn = fy_node_sequence_get_by_index(fyn, idx);
        if (trailing_slash)
            fyn = fy_node_follow_aliases(fyn, flags, false);
        fyn = fy_node_by_path_internal(fyn, s, len, flags);
        goto out;
    }

    /* be a little bit paranoid */
    assert(fy_node_is_mapping(fyn));

    path = s;
    pathlen = (size_t) (e - s);

    switch (ptr_flags) {
        default:
        case FYNWF_PTR_YAML:

            /* scan ahead for the end of the path component
		* note that we don't do UTF8 here, because all the
		* escapes are regular ascii characters, i.e.
		* '/', '*', '&', '.', '{', '}', '[', ']' and '\\'
		*/

            while (s < e) {
                c = *s;
                /* end of path component? */
                if (c == '/')
                    break;
                s++;

                if (c == '\\') {
                    /* it must be a valid escape */
                    if (s >= e || !strchr("/*&.{}[]\\", *s))
                        return NULL;
                    s++;
                } else if (c == '"') {
                    while (s < e && *s != '"') {
                        c = *s++;
                        if (c == '\\' && (s < e && *s == '"'))
                            s++;
                    }
                    /* not a normal double quote end */
                    if (s >= e || *s != '"')
                        return NULL;
                    s++;
                } else if (c == '\'') {
                    while (s < e && *s != '\'') {
                        c = *s++;
                        if (c == '\'' && (s < e && *s == '\''))
                            s++;
                    }
                    /* not a normal single quote end */
                    if (s >= e || *s != '\'')
                        return NULL;
                    s++;
                }
            }
            len = s - path;

            fynt = fyn;
            fyn = fy_node_mapping_lookup_by_string(fyn, path, len);

            /* failed! last ditch attempt, is there a merge key? */
            if (!fyn && fynt && (flags & FYNWF_FOLLOW) && ptr_flags == FYNWF_PTR_YAML) {
                fyn = fy_node_mapping_lookup_by_string(fynt, "<<", 2);
                if (!fyn)
                    goto out;

                if (fy_node_is_alias(fyn)) {

                    /* single alias '<<: *foo' */
                    fyn = fy_node_mapping_lookup_by_string(
                            fy_node_follow_aliases(fyn, flags, false), path, len);

                } else if (fy_node_is_sequence(fyn)) {

                    /* multi aliases '<<: [ *foo, *bar ]' */
                    fynt = fyn;
                    for (fyni = fy_node_list_head(&fynt->sequence); fyni;
                         fyni = fy_node_next(&fynt->sequence, fyni)) {
                        if (!fy_node_is_alias(fyni))
                            continue;
                        fyn = fy_node_mapping_lookup_by_string(
                                fy_node_follow_aliases(fyni, flags, false),
                                path, len);
                        if (fyn)
                            break;
                    }
                } else
                    fyn = NULL;
            }
            break;

        case FYNWF_PTR_JSON:
        case FYNWF_PTR_RELJSON:

            has_json_key_esc = false;
            while (s < e) {
                c = *s;
                /* end of path component? */
                if (c == '/')
                    break;
                s++;
                if (c == '~')
                    has_json_key_esc = true;
            }
            len = s - path;

            if (has_json_key_esc) {
                /* note that the escapes reduce the length, so allocating the
			 * same size is guaranteed safe */
                json_key = alloca(len + 1);

                ss = path;
                ee = s;
                t = json_key;
                while (ss < ee) {
                    if (*ss != '~') {
                        *t++ = *ss++;
                        continue;
                    }
                    /* unterminated ~ escape, or neither ~0, ~1 */
                    if (ss + 1 >= ee || (ss[1] < '0' && ss[1] > '1'))
                        return NULL;
                    *t++ = ss[1] == '0' ? '~' : '/';
                    ss += 2;
                }
                json_key_len = t - json_key;

                path = json_key;
                len = json_key_len;
            }

            /* URI encoded escaped */
            if ((flags & FYNWF_URI_ENCODED) && memchr(path, '%', len)) {
                /* escapes shrink, so safe to allocate as much */
                uri_path = alloca(len + 1);

                ss = path;
                ee = path + len;
                t = uri_path;
                while (ss < ee) {
                    /* copy run until '%' or end */
                    p = memchr(ss, '%', ee - ss);
                    rlen = (p ? p : ee) - ss;
                    memcpy(t, ss, rlen);
                    ss += rlen;
                    t += rlen;

                    /* if end, break */
                    if (!p)
                        break;

                    /* collect a utf8 character sequence */
                    code_length = sizeof(code);
                    ss = fy_uri_esc(ss, ee - ss, code, &code_length);
                    if (!ss) {
                        /* bad % escape sequence */
                        return NULL;
                    }
                    memcpy(t, code, code_length);
                    t += code_length;
                }
                uri_path_len = t - uri_path;

                path = uri_path;
                len = uri_path_len;
            }

            fynt = fyn;
            fyn = fy_node_mapping_lookup_value_by_simple_key(fyn, path, len);
            break;
    }

    len = e - s;

    if (len > 0 && trailing_slash) {
        /* fyd_notice(fyn->fyd, "%s:%d following alias @%s \"%.*s\"",
				__func__, __LINE__, fy_node_get_path(fyn), (int)(e - s), s); */
        fyn = fy_node_follow_aliases(fyn, flags, true);
    }

    fyn = fy_node_by_path_internal(fyn, s, len, flags);

    out:
    len = e - s;

    if (len > 0 && trailing_slash) {
        /* fyd_notice(fyn->fyd, "%s:%d following alias @%s \"%.*s\"",
				__func__, __LINE__, fy_node_get_path(fyn), (int)(e - s), s); */
        fyn = fy_node_follow_aliases(fyn, flags, true);
    }

    return fyn;
}